

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool __thiscall cmCTestSVN::StatusParser::ProcessLine(StatusParser *this)

{
  char path_status;
  char prop_status;
  char *pcVar1;
  bool bVar2;
  string local_78;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  undefined8 local_30;
  char local_28;
  undefined7 uStack_27;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexStatus,(this->super_LineParser).Line._M_dataplus._M_p);
  if (bVar2) {
    pcVar1 = (this->RegexStatus).startp[1];
    if (pcVar1 == (char *)0x0) {
      local_38 = &local_28;
      local_30 = 0;
      local_28 = '\0';
    }
    else {
      local_38 = &local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,pcVar1,(this->RegexStatus).endp[1]);
    }
    path_status = *local_38;
    pcVar1 = (this->RegexStatus).startp[2];
    if (pcVar1 == (char *)0x0) {
      local_58 = &local_48;
      local_50 = 0;
      local_48 = '\0';
    }
    else {
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar1,(this->RegexStatus).endp[2]);
    }
    prop_status = *local_58;
    pcVar1 = (this->RegexStatus).startp[3];
    if (pcVar1 == (char *)0x0) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,pcVar1,(this->RegexStatus).endp[3]);
    }
    DoPath(this,path_status,prop_status,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
    }
  }
  return true;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->RegexStatus.find(this->Line)) {
      this->DoPath(this->RegexStatus.match(1)[0],
                   this->RegexStatus.match(2)[0], this->RegexStatus.match(3));
    }
    return true;
  }